

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::SourceCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type,bool castFromDest)

{
  BaseType BVar1;
  char *__s;
  Type local_28;
  
  BVar1 = type->base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_28.base_type = type->element;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    SourceCast_abi_cxx11_(__return_storage_ptr__,this,&local_28,castFromDest);
    return __return_storage_ptr__;
  }
  if (castFromDest) {
    if (BVar1 == BASE_TYPE_UCHAR) {
      __s = "(byte) ";
      goto LAB_001bf230;
    }
    if (BVar1 == BASE_TYPE_USHORT) {
      __s = "(short) ";
      goto LAB_001bf230;
    }
    if (BVar1 == BASE_TYPE_UINT) {
      __s = "(int) ";
      goto LAB_001bf230;
    }
  }
  __s = "";
LAB_001bf230:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCast(const Type &type, bool castFromDest) const {
    if (IsSeries(type)) {
      return SourceCast(type.VectorType(), castFromDest);
    } else {
      if (castFromDest) {
        if (type.base_type == BASE_TYPE_UINT)
          return "(int) ";
        else if (type.base_type == BASE_TYPE_USHORT)
          return "(short) ";
        else if (type.base_type == BASE_TYPE_UCHAR)
          return "(byte) ";
      }
    }
    return "";
  }